

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O2

void av1_dr_prediction_z2_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  uint8_t auVar1 [16];
  long lVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  int j;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar27;
  short sVar28;
  ushort uVar29;
  short sVar30;
  ushort uVar31;
  short sVar32;
  ushort uVar33;
  ushort uVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  undefined1 in_XMM2 [16];
  short sVar38;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM9 [16];
  ushort uVar53;
  undefined8 uVar54;
  ushort uVar58;
  ushort uVar59;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ushort uVar60;
  ushort uVar64;
  undefined1 auVar57 [16];
  short sVar65;
  short sVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ulong uVar73;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  short sVar85;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  short sVar97;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  uint8_t *local_60;
  short sVar39;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  undefined1 auVar88 [16];
  
  bVar7 = (byte)upsample_above;
  local_60 = dst;
  if (bw == 8) {
    iVar8 = -1 << (bVar7 & 0x1f);
    auVar18 = ZEXT416((uint)(-1 << ((byte)upsample_left & 0x1f)));
    auVar18 = pshuflw(auVar18,auVar18,0);
    sVar27 = auVar18._0_2_;
    sVar28 = auVar18._2_2_;
    auVar18 = pshuflw(ZEXT416((uint)dy),ZEXT416((uint)dy),0);
    sVar30 = auVar18._0_2_;
    sVar32 = auVar18._2_2_;
    auVar18._0_2_ = (ushort)-sVar30 >> 1;
    auVar18._2_2_ = (ushort)(sVar32 * -2) >> 1;
    auVar18._4_2_ = (ushort)(sVar30 * -3) >> 1;
    auVar18._6_2_ = (ushort)(sVar32 * -4) >> 1;
    auVar18._8_2_ = (ushort)(sVar30 * -5) >> 1;
    auVar18._10_2_ = (ushort)(sVar32 * -6) >> 1;
    auVar18._12_2_ = (ushort)(sVar30 * -7) >> 1;
    auVar18._14_2_ = (ushort)(sVar32 * -8) >> 1;
    auVar18 = auVar18 & _DAT_0046f0e0;
    if (bh < 1) {
      bh = 0;
    }
    iVar15 = -dx;
    auVar52 = pmovsxbw(in_XMM6,0x1010101010101010);
    auVar19 = pmovsxbw(in_XMM8,0x1f1f1f1f1f1f1f1f);
    uVar13 = 0;
    uVar12 = dx;
    while (bVar16 = bh != 0, bh = bh + -1, bVar16) {
      uVar14 = iVar15 >> (6 - bVar7 & 0x1f);
      iVar5 = (int)(~uVar14 + iVar8) >> (bVar7 & 0x1f);
      if (iVar8 + -1 <= (int)uVar14) {
        iVar5 = 0;
      }
      uVar4 = (int)((iVar8 + upsample_above) - uVar14) >> (bVar7 & 0x1f);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      if (7 < (int)uVar4) {
        uVar4 = 8;
      }
      auVar56 = (undefined1  [16])0x0;
      if (iVar5 < 8) {
        auVar56 = *(undefined1 (*) [16])(above + (long)iVar5 + (long)(int)uVar14);
        auVar67 = pshuflw(ZEXT416(uVar12),ZEXT416(uVar12),0);
        sVar65 = auVar67._0_2_;
        auVar22._0_2_ = 0x80 - sVar65;
        sVar72 = auVar67._2_2_;
        auVar22._2_2_ = 0xc0 - sVar72;
        auVar22._4_2_ = 0x100 - sVar65;
        auVar22._6_2_ = 0x140 - sVar72;
        auVar22._8_2_ = 0x180 - sVar65;
        auVar22._10_2_ = 0x1c0 - sVar72;
        auVar22._12_2_ = 0x200 - sVar65;
        auVar22._14_2_ = -sVar72;
        if (upsample_above == 0) {
          auVar67 = pshufb(auVar56,(undefined1  [16])LoadMaskx[iVar5]);
          auVar56 = pshufb(auVar56 >> 8,(undefined1  [16])LoadMaskx[iVar5]);
        }
        else {
          auVar67 = pshufb(auVar56,(undefined1  [16])EvenOddMaskx[iVar5]);
          auVar56 = auVar67 >> 0x40;
          auVar22 = psllw(auVar22,ZEXT416((uint)upsample_above));
        }
        auVar69._0_2_ = auVar22._0_2_ >> 1;
        auVar69._2_2_ = auVar22._2_2_ >> 1;
        auVar69._4_2_ = auVar22._4_2_ >> 1;
        auVar69._6_2_ = auVar22._6_2_ >> 1;
        auVar69._8_2_ = auVar22._8_2_ >> 1;
        auVar69._10_2_ = auVar22._10_2_ >> 1;
        auVar69._12_2_ = auVar22._12_2_ >> 1;
        auVar69._14_2_ = auVar22._14_2_ >> 1;
        auVar67 = pmovzxbw(auVar67,auVar67);
        auVar22 = pmovzxbw(auVar56,auVar56);
        auVar56 = psllw(auVar67,5);
        auVar69 = auVar69 & auVar19;
        uVar29 = (ushort)(auVar69._0_2_ * (auVar22._0_2_ - auVar67._0_2_) + auVar56._0_2_ +
                         auVar52._0_2_) >> 5;
        uVar31 = (ushort)(auVar69._2_2_ * (auVar22._2_2_ - auVar67._2_2_) + auVar56._2_2_ +
                         auVar52._2_2_) >> 5;
        uVar33 = (ushort)(auVar69._4_2_ * (auVar22._4_2_ - auVar67._4_2_) + auVar56._4_2_ +
                         auVar52._4_2_) >> 5;
        uVar34 = (ushort)(auVar69._6_2_ * (auVar22._6_2_ - auVar67._6_2_) + auVar56._6_2_ +
                         auVar52._6_2_) >> 5;
        uVar53 = (ushort)(auVar69._8_2_ * (auVar22._8_2_ - auVar67._8_2_) + auVar56._8_2_ +
                         auVar52._8_2_) >> 5;
        uVar58 = (ushort)(auVar69._10_2_ * (auVar22._10_2_ - auVar67._10_2_) + auVar56._10_2_ +
                         auVar52._10_2_) >> 5;
        uVar59 = (ushort)(auVar69._12_2_ * (auVar22._12_2_ - auVar67._12_2_) + auVar56._12_2_ +
                         auVar52._12_2_) >> 5;
        uVar60 = (ushort)(auVar69._14_2_ * (auVar22._14_2_ - auVar67._14_2_) + auVar56._14_2_ +
                         auVar52._14_2_) >> 5;
        auVar56[1] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
        auVar56[0] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
        auVar56[2] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
        auVar56[3] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
        auVar56[4] = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
        auVar56[5] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
        auVar56[6] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
        auVar56[7] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
        auVar56[8] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
        auVar56[9] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
        auVar56[10] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
        auVar56[0xb] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
        auVar56[0xc] = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
        auVar56[0xd] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
        auVar56[0xe] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
        auVar56[0xf] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
      }
      uVar54 = auVar56._0_8_;
      if ((int)uVar14 < iVar8) {
        auVar67 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0);
        sVar65 = auVar67._0_2_;
        auVar40._0_2_ = sVar65 + -sVar30;
        sVar72 = auVar67._2_2_;
        auVar40._2_2_ = sVar72 + sVar32 * -2;
        auVar40._4_2_ = sVar65 + sVar30 * -3;
        auVar40._6_2_ = sVar72 + sVar32 * -4;
        auVar40._8_2_ = sVar65 + sVar30 * -5;
        auVar40._10_2_ = sVar72 + sVar32 * -6;
        auVar40._12_2_ = sVar65 + sVar30 * -7;
        auVar40._14_2_ = sVar72 + sVar32 * -8;
        auVar67 = auVar18;
        if (upsample_left != 0) {
          auVar22 = psllw(auVar40,ZEXT416((uint)upsample_left));
          auVar67._0_2_ = auVar22._0_2_ >> 1;
          auVar67._2_2_ = auVar22._2_2_ >> 1;
          auVar67._4_2_ = auVar22._4_2_ >> 1;
          auVar67._6_2_ = auVar22._6_2_ >> 1;
          auVar67._8_2_ = auVar22._8_2_ >> 1;
          auVar67._10_2_ = auVar22._10_2_ >> 1;
          auVar67._12_2_ = auVar22._12_2_ >> 1;
          auVar67._14_2_ = auVar22._14_2_ >> 1;
          auVar67 = auVar67 & auVar19;
        }
        auVar22 = psraw(auVar40,ZEXT416(6 - upsample_left));
        auVar74._0_2_ = -(ushort)(auVar22._0_2_ < sVar27);
        auVar74._2_2_ = -(ushort)(auVar22._2_2_ < sVar28);
        auVar74._4_2_ = -(ushort)(auVar22._4_2_ < sVar27);
        auVar74._6_2_ = -(ushort)(auVar22._6_2_ < sVar28);
        auVar74._8_2_ = -(ushort)(auVar22._8_2_ < sVar27);
        auVar74._10_2_ = -(ushort)(auVar22._10_2_ < sVar28);
        auVar74._12_2_ = -(ushort)(auVar22._12_2_ < sVar27);
        auVar74._14_2_ = -(ushort)(auVar22._14_2_ < sVar28);
        auVar22 = ~auVar74 & auVar22;
        auVar76._8_8_ =
             (ulong)left[auVar22._8_2_] | (ulong)left[auVar22._10_2_] << 0x10 |
             (ulong)left[auVar22._12_2_] << 0x20 | (ulong)(ushort)left[auVar22._14_2_] << 0x30;
        auVar76._0_8_ =
             (ulong)left[auVar22._0_2_] | (ulong)left[auVar22._2_2_] << 0x10 |
             (ulong)left[auVar22._4_2_] << 0x20 | (ulong)(ushort)left[auVar22._6_2_] << 0x30;
        auVar69 = psllw(auVar76,5);
        uVar29 = (ushort)(auVar69._0_2_ +
                          ((ushort)left[(short)(auVar22._0_2_ + 1)] - (ushort)left[auVar22._0_2_]) *
                          auVar67._0_2_ + auVar52._0_2_) >> 5;
        uVar31 = (ushort)(auVar69._2_2_ +
                          ((ushort)left[(short)(auVar22._2_2_ + 1)] - (ushort)left[auVar22._2_2_]) *
                          auVar67._2_2_ + auVar52._2_2_) >> 5;
        uVar33 = (ushort)(auVar69._4_2_ +
                          ((ushort)left[(short)(auVar22._4_2_ + 1)] - (ushort)left[auVar22._4_2_]) *
                          auVar67._4_2_ + auVar52._4_2_) >> 5;
        uVar34 = (ushort)(auVar69._6_2_ +
                          ((ushort)left[(short)(auVar22._6_2_ + 1)] - (ushort)left[auVar22._6_2_]) *
                          auVar67._6_2_ + auVar52._6_2_) >> 5;
        uVar53 = (ushort)(auVar69._8_2_ +
                          ((ushort)left[(short)(auVar22._8_2_ + 1)] - (ushort)left[auVar22._8_2_]) *
                          auVar67._8_2_ + auVar52._8_2_) >> 5;
        uVar58 = (ushort)(auVar69._10_2_ +
                          ((ushort)left[(short)(auVar22._10_2_ + 1)] - (ushort)left[auVar22._10_2_])
                          * auVar67._10_2_ + auVar52._10_2_) >> 5;
        uVar59 = (ushort)(auVar69._12_2_ +
                          ((ushort)left[(short)(auVar22._12_2_ + 1)] - (ushort)left[auVar22._12_2_])
                          * auVar67._12_2_ + auVar52._12_2_) >> 5;
        uVar60 = (ushort)(auVar69._14_2_ +
                          ((ushort)left[(short)(auVar22._14_2_ + 1)] - (ushort)left[auVar22._14_2_])
                          * auVar67._14_2_ + auVar52._14_2_) >> 5;
        auVar77[1] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
        auVar77[0] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
        auVar77[2] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
        auVar77[3] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
        auVar77[4] = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
        auVar77[5] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
        auVar77[6] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
        auVar77[7] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
        auVar77[8] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
        auVar77[9] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
        auVar77[10] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
        auVar77[0xb] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
        auVar77[0xc] = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
        auVar77[0xd] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
        auVar77[0xe] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
        auVar77[0xf] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
        auVar56 = pblendvb(auVar56,auVar77,(undefined1  [16])Mask[0][uVar4]);
        uVar54 = auVar56._0_8_;
      }
      *(undefined8 *)local_60 = uVar54;
      local_60 = local_60 + stride;
      uVar13 = uVar13 + 0x40;
      iVar15 = iVar15 - dx;
      uVar12 = uVar12 + dx;
    }
  }
  else if (bw == 4) {
    iVar8 = -1 << (bVar7 & 0x1f);
    auVar18 = ZEXT416((uint)(-1 << ((byte)upsample_left & 0x1f)));
    auVar18 = pshuflw(auVar18,auVar18,0);
    sVar27 = auVar18._0_2_;
    sVar28 = auVar18._2_2_;
    auVar18 = pshuflw(ZEXT416((uint)dy),ZEXT416((uint)dy),0);
    uVar29 = -auVar18._0_2_;
    uVar31 = auVar18._2_2_ * -2;
    uVar33 = auVar18._0_2_ * -3;
    uVar34 = auVar18._2_2_ * -4;
    uVar11 = (ulong)DAT_0046f0e0;
    if (bh < 1) {
      bh = 0;
    }
    iVar15 = -dx;
    auVar18 = pmovsxbw(in_XMM7,0x1f1f1f1f1f1f1f1f);
    auVar52 = pmovsxbw(in_XMM8,0x1010101010101010);
    uVar13 = 0;
    uVar12 = dx;
    while (bVar16 = bh != 0, bh = bh + -1, bVar16) {
      uVar14 = iVar15 >> (6 - bVar7 & 0x1f);
      iVar5 = (int)(~uVar14 + iVar8) >> (bVar7 & 0x1f);
      if (iVar8 + -1 <= (int)uVar14) {
        iVar5 = 0;
      }
      uVar4 = (int)((iVar8 + upsample_above) - uVar14) >> (bVar7 & 0x1f);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      uVar6 = (ulong)uVar4;
      if (3 < (int)uVar4) {
        uVar6 = 4;
      }
      auVar19 = (undefined1  [16])0x0;
      auVar66 = (undefined1  [16])0x0;
      auVar55 = (undefined1  [16])0x0;
      if (iVar5 < 4) {
        auVar19 = pshuflw(ZEXT416(uVar12),ZEXT416(uVar12),0);
        sVar30 = auVar19._0_2_;
        sVar32 = auVar19._2_2_;
        auVar20._2_2_ = 0x40 - sVar32;
        auVar20._0_2_ = -sVar30;
        auVar20._4_2_ = 0x80 - sVar30;
        auVar20._6_2_ = 0xc0 - sVar32;
        auVar20._8_2_ = 0x100 - sVar30;
        auVar20._10_2_ = -sVar32;
        auVar20._12_2_ = -sVar30;
        auVar20._14_2_ = -sVar32;
        if (upsample_above == 0) {
          auVar56 = pshufb(*(undefined1 (*) [16])(above + (long)iVar5 + (long)(int)uVar14),
                           (undefined1  [16])LoadMaskx[iVar5]);
          auVar67 = auVar56 >> 8;
        }
        else {
          auVar56 = pshufb(*(undefined1 (*) [16])(above + (long)iVar5 + (long)(int)uVar14),
                           (undefined1  [16])EvenOddMaskx[iVar5]);
          auVar67 = auVar56 >> 0x40;
          auVar20 = psllw(auVar20,ZEXT416((uint)upsample_above));
        }
        auVar21._0_2_ = auVar20._0_2_ >> 1;
        auVar21._2_2_ = auVar20._2_2_ >> 1;
        auVar21._4_2_ = auVar20._4_2_ >> 1;
        auVar21._6_2_ = auVar20._6_2_ >> 1;
        auVar21._8_2_ = auVar20._8_2_ >> 1;
        auVar21._10_2_ = auVar20._10_2_ >> 1;
        auVar21._12_2_ = auVar20._12_2_ >> 1;
        auVar21._14_2_ = auVar20._14_2_ >> 1;
        auVar19 = auVar21 & auVar18;
        auVar55 = pmovzxbw(auVar56,auVar56);
        auVar66 = pmovzxbw(auVar67,auVar67);
      }
      if ((int)uVar14 < iVar8) {
        auVar56 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0);
        sVar30 = auVar56._0_2_;
        auVar86._0_2_ = sVar30 + uVar29;
        sVar32 = auVar56._2_2_;
        auVar86._2_2_ = sVar32 + uVar31;
        auVar86._4_2_ = sVar30 + uVar33;
        auVar86._6_2_ = sVar32 + uVar34;
        auVar86._8_2_ = sVar30;
        auVar86._10_2_ = sVar32;
        auVar86._12_2_ = sVar30;
        auVar86._14_2_ = sVar32;
        uVar73 = CONCAT26(uVar34 >> 1,CONCAT24(uVar33 >> 1,CONCAT22(uVar31 >> 1,uVar29 >> 1))) &
                 uVar11;
        if (upsample_left != 0) {
          auVar56 = psllw(auVar86,ZEXT416((uint)upsample_left));
          uVar73 = CONCAT26(auVar56._6_2_ >> 1,
                            CONCAT24(auVar56._4_2_ >> 1,
                                     CONCAT22(auVar56._2_2_ >> 1,auVar56._0_2_ >> 1))) &
                   auVar18._0_8_;
        }
        auVar56 = psraw(auVar86,ZEXT416(6 - upsample_left));
        auVar82._0_2_ = -(ushort)(auVar56._0_2_ < sVar27);
        auVar82._2_2_ = -(ushort)(auVar56._2_2_ < sVar28);
        auVar82._4_2_ = -(ushort)(auVar56._4_2_ < sVar27);
        auVar82._6_2_ = -(ushort)(auVar56._6_2_ < sVar28);
        auVar82._8_2_ = -(ushort)(auVar56._8_2_ < sVar27);
        auVar82._10_2_ = -(ushort)(auVar56._10_2_ < sVar28);
        auVar82._12_2_ = -(ushort)(auVar56._12_2_ < sVar27);
        auVar82._14_2_ = -(ushort)(auVar56._14_2_ < sVar28);
        auVar56 = ~auVar82 & auVar56;
        auVar55._8_8_ =
             (ulong)left[auVar56._0_2_] | (ulong)left[auVar56._2_2_] << 0x10 |
             (ulong)left[auVar56._4_2_] << 0x20 | (ulong)left[auVar56._6_2_] << 0x30;
        auVar66._8_8_ =
             (ulong)left[(short)(auVar56._0_2_ + 1)] |
             (ulong)left[(short)(auVar56._2_2_ + 1)] << 0x10 |
             (ulong)left[(short)(auVar56._4_2_ + 1)] << 0x20 |
             (ulong)left[(short)(auVar56._6_2_ + 1)] << 0x30;
        auVar19._8_8_ = uVar73;
      }
      auVar56 = psllw(auVar55,5);
      uVar53 = (ushort)(auVar56._0_2_ + (auVar66._0_2_ - auVar55._0_2_) * auVar19._0_2_ +
                       auVar52._0_2_) >> 5;
      uVar58 = (ushort)(auVar56._2_2_ + (auVar66._2_2_ - auVar55._2_2_) * auVar19._2_2_ +
                       auVar52._2_2_) >> 5;
      uVar59 = (ushort)(auVar56._4_2_ + (auVar66._4_2_ - auVar55._4_2_) * auVar19._4_2_ +
                       auVar52._4_2_) >> 5;
      uVar60 = (ushort)(auVar56._6_2_ + (auVar66._6_2_ - auVar55._6_2_) * auVar19._6_2_ +
                       auVar52._6_2_) >> 5;
      uVar61 = (ushort)(auVar56._8_2_ + (auVar66._8_2_ - auVar55._8_2_) * auVar19._8_2_ +
                       auVar52._8_2_) >> 5;
      uVar62 = (ushort)(auVar56._10_2_ + (auVar66._10_2_ - auVar55._10_2_) * auVar19._10_2_ +
                       auVar52._10_2_) >> 5;
      uVar63 = (ushort)(auVar56._12_2_ + (auVar66._12_2_ - auVar55._12_2_) * auVar19._12_2_ +
                       auVar52._12_2_) >> 5;
      uVar64 = (ushort)(auVar56._14_2_ + (auVar66._14_2_ - auVar55._14_2_) * auVar19._14_2_ +
                       auVar52._14_2_) >> 5;
      auVar57._0_8_ =
           CONCAT17((uVar64 != 0) * (uVar64 < 0x100) * (char)uVar64 - (0xff < uVar64),
                    CONCAT16((uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63),
                             CONCAT15((uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 -
                                      (0xff < uVar62),
                                      CONCAT14((uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 -
                                               (0xff < uVar61),
                                               CONCAT13((uVar60 != 0) * (uVar60 < 0x100) *
                                                        (char)uVar60 - (0xff < uVar60),
                                                        CONCAT12((uVar59 != 0) * (uVar59 < 0x100) *
                                                                 (char)uVar59 - (0xff < uVar59),
                                                                 CONCAT11((uVar58 != 0) *
                                                                          (uVar58 < 0x100) *
                                                                          (char)uVar58 -
                                                                          (0xff < uVar58),
                                                                          (uVar53 != 0) *
                                                                          (uVar53 < 0x100) *
                                                                          (char)uVar53 -
                                                                          (0xff < uVar53))))))));
      auVar57[8] = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
      auVar57[9] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
      auVar57[10] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
      auVar57[0xb] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
      auVar57[0xc] = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
      auVar57[0xd] = (uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62);
      auVar57[0xe] = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
      auVar57[0xf] = (uVar64 != 0) * (uVar64 < 0x100) * (char)uVar64 - (0xff < uVar64);
      uVar17 = (undefined4)((ulong)auVar57._0_8_ >> 0x20);
      auVar68._4_4_ = uVar17;
      auVar68._0_4_ = uVar17;
      auVar68._8_4_ = uVar17;
      auVar68._12_4_ = uVar17;
      auVar19 = pblendvb(auVar57,auVar68,(undefined1  [16])Mask[0][uVar6]);
      *(int *)dst = auVar19._0_4_;
      dst = dst + stride;
      uVar13 = uVar13 + 0x40;
      iVar15 = iVar15 - dx;
      uVar12 = uVar12 + dx;
    }
  }
  else {
    auVar18 = pshuflw(ZEXT416((uint)dy),ZEXT416((uint)dy),0);
    sVar27 = auVar18._0_2_;
    sVar28 = auVar18._2_2_;
    if (bh < 1) {
      bh = 0;
    }
    auVar18 = pmovsxbw(in_XMM2,0x1010101010101010);
    auVar52 = pmovsxbw(in_XMM8,0x1f1f1f1f1f1f1f1f);
    auVar19 = pmovsxbw(in_XMM9,0xfefefefefefefefe);
    for (uVar12 = 0; uVar12 != bh; uVar12 = uVar12 + 1) {
      uVar13 = (int)(~uVar12 * dx) >> 6;
      uVar14 = ~uVar13;
      auVar56 = ZEXT416(~uVar12 * dx >> 1 & 0x1f);
      auVar56 = pshuflw(auVar56,auVar56,0);
      auVar67 = pshuflw(ZEXT416(uVar12),ZEXT416(uVar12),0);
      uVar17 = auVar67._0_4_;
      auVar51._4_4_ = uVar17;
      auVar51._0_4_ = uVar17;
      auVar51._8_4_ = uVar17;
      auVar51._12_4_ = uVar17;
      auVar67 = psllw(auVar51,6);
      for (lVar9 = 0; lVar9 < bw; lVar9 = lVar9 + 0x10) {
        uVar4 = uVar14 - 1;
        if (-3 < (int)uVar13 + lVar9) {
          uVar4 = 0;
        }
        uVar10 = 0;
        if (0 < (int)uVar14) {
          uVar10 = uVar14;
        }
        uVar11 = (ulong)uVar10;
        if (0xf < (int)uVar10) {
          uVar11 = 0x10;
        }
        auVar87 = (undefined1  [16])0x0;
        auVar75 = (undefined1  [16])0x0;
        sVar30 = auVar18._0_2_;
        sVar32 = auVar18._2_2_;
        sVar65 = auVar18._4_2_;
        sVar72 = auVar18._6_2_;
        sVar35 = auVar18._8_2_;
        sVar36 = auVar18._10_2_;
        sVar37 = auVar18._12_2_;
        sVar38 = auVar18._14_2_;
        if ((int)uVar4 < 0x10) {
          lVar2 = (ulong)uVar4 + (long)(int)uVar13;
          auVar1 = LoadMaskx[uVar4];
          auVar22 = pshufb(*(undefined1 (*) [16])(above + lVar9 + lVar2),(undefined1  [16])auVar1);
          auVar40 = pshufb(*(undefined1 (*) [16])(above + lVar9 + 1 + lVar2),
                           (undefined1  [16])auVar1);
          auVar76 = pmovzxbw((undefined1  [16])0x0,auVar22);
          auVar69 = pmovzxbw((undefined1  [16])auVar1,auVar40);
          auVar77 = psllw(auVar76,5);
          sVar3 = auVar56._0_2_;
          sVar39 = auVar56._2_2_;
          uVar61 = (ushort)(auVar77._0_2_ + sVar30 + (auVar69._0_2_ - auVar76._0_2_) * sVar3) >> 5;
          uVar62 = (ushort)(auVar77._2_2_ + sVar32 + (auVar69._2_2_ - auVar76._2_2_) * sVar39) >> 5;
          uVar63 = (ushort)(auVar77._4_2_ + sVar65 + (auVar69._4_2_ - auVar76._4_2_) * sVar3) >> 5;
          uVar64 = (ushort)(auVar77._6_2_ + sVar72 + (auVar69._6_2_ - auVar76._6_2_) * sVar39) >> 5;
          uVar78 = (ushort)(auVar77._8_2_ + sVar35 + (auVar69._8_2_ - auVar76._8_2_) * sVar3) >> 5;
          uVar79 = (ushort)(auVar77._10_2_ + sVar36 + (auVar69._10_2_ - auVar76._10_2_) * sVar39) >>
                   5;
          uVar80 = (ushort)(auVar77._12_2_ + sVar37 + (auVar69._12_2_ - auVar76._12_2_) * sVar3) >>
                   5;
          uVar81 = (ushort)(auVar77._14_2_ + sVar38 + (auVar69._14_2_ - auVar76._14_2_) * sVar39) >>
                   5;
          auVar23._0_2_ = CONCAT11(0,auVar22[8]);
          auVar23[2] = auVar22[9];
          auVar23[3] = 0;
          auVar23[4] = auVar22[10];
          auVar23[5] = 0;
          auVar23[6] = auVar22[0xb];
          auVar23[7] = 0;
          auVar23[8] = auVar22[0xc];
          auVar23[9] = 0;
          auVar23[10] = auVar22[0xd];
          auVar23[0xb] = 0;
          auVar23[0xc] = auVar22[0xe];
          auVar23[0xd] = 0;
          auVar23[0xe] = auVar22[0xf];
          auVar23[0xf] = 0;
          auVar69 = psllw(auVar23,5);
          uVar29 = (ushort)(auVar69._0_2_ + sVar30 + (auVar40[8] - auVar23._0_2_) * sVar3) >> 5;
          uVar31 = (ushort)(auVar69._2_2_ + sVar32 +
                           ((ushort)auVar40[9] - (ushort)auVar22[9]) * sVar39) >> 5;
          uVar33 = (ushort)(auVar69._4_2_ + sVar65 +
                           ((ushort)auVar40[10] - (ushort)auVar22[10]) * sVar3) >> 5;
          uVar34 = (ushort)(auVar69._6_2_ + sVar72 +
                           ((ushort)auVar40[0xb] - (ushort)auVar22[0xb]) * sVar39) >> 5;
          uVar53 = (ushort)(auVar69._8_2_ + sVar35 +
                           ((ushort)auVar40[0xc] - (ushort)auVar22[0xc]) * sVar3) >> 5;
          uVar58 = (ushort)(auVar69._10_2_ + sVar36 +
                           ((ushort)auVar40[0xd] - (ushort)auVar22[0xd]) * sVar39) >> 5;
          uVar59 = (ushort)(auVar69._12_2_ + sVar37 +
                           ((ushort)auVar40[0xe] - (ushort)auVar22[0xe]) * sVar3) >> 5;
          uVar60 = (ushort)(auVar69._14_2_ + sVar38 +
                           ((ushort)auVar40[0xf] - (ushort)auVar22[0xf]) * sVar39) >> 5;
          auVar75[1] = (uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62);
          auVar75[0] = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
          auVar75[2] = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
          auVar75[3] = (uVar64 != 0) * (uVar64 < 0x100) * (char)uVar64 - (0xff < uVar64);
          auVar75[4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
          auVar75[5] = (uVar79 != 0) * (uVar79 < 0x100) * (char)uVar79 - (0xff < uVar79);
          auVar75[6] = (uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80);
          auVar75[7] = (uVar81 != 0) * (uVar81 < 0x100) * (char)uVar81 - (0xff < uVar81);
          auVar75[8] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
          auVar75[9] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
          auVar75[10] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
          auVar75[0xb] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
          auVar75[0xc] = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
          auVar75[0xd] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
          auVar75[0xe] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
          auVar75[0xf] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
        }
        if ((int)uVar13 < -1) {
          auVar22 = pshuflw(ZEXT416((uint)lVar9),ZEXT416((uint)lVar9),0);
          uVar17 = auVar22._0_4_;
          auVar24._4_4_ = uVar17;
          auVar24._0_4_ = uVar17;
          auVar24._8_4_ = uVar17;
          auVar24._12_4_ = uVar17;
          auVar24 = auVar24 | _DAT_0046f120;
          sVar3 = auVar22._0_2_;
          sVar39 = auVar22._2_2_;
          uVar29 = auVar24._0_2_ * sVar27;
          uVar31 = auVar24._2_2_ * sVar28;
          uVar33 = auVar24._4_2_ * sVar27;
          uVar34 = auVar24._6_2_ * sVar28;
          uVar53 = auVar24._8_2_ * sVar27;
          uVar58 = auVar24._10_2_ * sVar28;
          uVar59 = auVar24._12_2_ * sVar27;
          uVar60 = auVar24._14_2_ * sVar28;
          uVar61 = (sVar3 + 9) * sVar27;
          uVar62 = (sVar39 + 10) * sVar28;
          uVar63 = (sVar3 + 0xb) * sVar27;
          uVar64 = (sVar39 + 0xc) * sVar28;
          uVar78 = (sVar3 + 0xd) * sVar27;
          uVar79 = (sVar39 + 0xe) * sVar28;
          uVar80 = (sVar3 + 0xf) * sVar27;
          uVar81 = (sVar39 + 0x10) * sVar28;
          auVar70._0_2_ =
               auVar67._0_2_ - ((ushort)(0x7fff < uVar29) * 0x7fff | (0x7fff >= uVar29) * uVar29);
          auVar70._2_2_ =
               auVar67._2_2_ - ((ushort)(0x7fff < uVar31) * 0x7fff | (0x7fff >= uVar31) * uVar31);
          auVar70._4_2_ =
               auVar67._4_2_ - ((ushort)(0x7fff < uVar33) * 0x7fff | (0x7fff >= uVar33) * uVar33);
          auVar70._6_2_ =
               auVar67._6_2_ - ((ushort)(0x7fff < uVar34) * 0x7fff | (0x7fff >= uVar34) * uVar34);
          auVar70._8_2_ =
               auVar67._8_2_ - ((ushort)(0x7fff < uVar53) * 0x7fff | (0x7fff >= uVar53) * uVar53);
          auVar70._10_2_ =
               auVar67._10_2_ - ((ushort)(0x7fff < uVar58) * 0x7fff | (0x7fff >= uVar58) * uVar58);
          auVar70._12_2_ =
               auVar67._12_2_ - ((ushort)(0x7fff < uVar59) * 0x7fff | (0x7fff >= uVar59) * uVar59);
          auVar70._14_2_ =
               auVar67._14_2_ - ((ushort)(0x7fff < uVar60) * 0x7fff | (0x7fff >= uVar60) * uVar60);
          auVar25._0_2_ =
               auVar67._0_2_ - ((ushort)(0x7fff < uVar61) * 0x7fff | (0x7fff >= uVar61) * uVar61);
          auVar25._2_2_ =
               auVar67._2_2_ - ((ushort)(0x7fff < uVar62) * 0x7fff | (0x7fff >= uVar62) * uVar62);
          auVar25._4_2_ =
               auVar67._4_2_ - ((ushort)(0x7fff < uVar63) * 0x7fff | (0x7fff >= uVar63) * uVar63);
          auVar25._6_2_ =
               auVar67._6_2_ - ((ushort)(0x7fff < uVar64) * 0x7fff | (0x7fff >= uVar64) * uVar64);
          auVar25._8_2_ =
               auVar67._8_2_ - ((ushort)(0x7fff < uVar78) * 0x7fff | (0x7fff >= uVar78) * uVar78);
          auVar25._10_2_ =
               auVar67._10_2_ - ((ushort)(0x7fff < uVar79) * 0x7fff | (0x7fff >= uVar79) * uVar79);
          auVar25._12_2_ =
               auVar67._12_2_ - ((ushort)(0x7fff < uVar80) * 0x7fff | (0x7fff >= uVar80) * uVar80);
          auVar25._14_2_ =
               auVar67._14_2_ - ((ushort)(0x7fff < uVar81) * 0x7fff | (0x7fff >= uVar81) * uVar81);
          auVar22 = psraw(auVar70,6);
          auVar69 = psraw(auVar25,6);
          sVar39 = auVar69._0_2_;
          auVar41._0_2_ = -(ushort)(sVar39 < -1) | (ushort)(sVar39 >= -1) * sVar39;
          sVar44 = auVar69._2_2_;
          auVar41._2_2_ = -(ushort)(sVar44 < -1) | (ushort)(sVar44 >= -1) * sVar44;
          sVar45 = auVar69._4_2_;
          auVar41._4_2_ = -(ushort)(sVar45 < -1) | (ushort)(sVar45 >= -1) * sVar45;
          sVar46 = auVar69._6_2_;
          auVar41._6_2_ = -(ushort)(sVar46 < -1) | (ushort)(sVar46 >= -1) * sVar46;
          sVar47 = auVar69._8_2_;
          auVar41._8_2_ = -(ushort)(sVar47 < -1) | (ushort)(sVar47 >= -1) * sVar47;
          sVar48 = auVar69._10_2_;
          auVar41._10_2_ = -(ushort)(sVar48 < -1) | (ushort)(sVar48 >= -1) * sVar48;
          sVar49 = auVar69._12_2_;
          sVar50 = auVar69._14_2_;
          auVar41._12_2_ = -(ushort)(sVar49 < -1) | (ushort)(sVar49 >= -1) * sVar49;
          auVar41._14_2_ = -(ushort)(sVar50 < -1) | (ushort)(sVar50 >= -1) * sVar50;
          sVar85 = auVar22._0_2_;
          uVar29 = -(ushort)(sVar85 < -1) | (ushort)(sVar85 >= -1) * sVar85;
          sVar91 = auVar22._2_2_;
          uVar31 = -(ushort)(sVar91 < -1) | (ushort)(sVar91 >= -1) * sVar91;
          auVar88._0_4_ = CONCAT22(uVar31,uVar29);
          sVar92 = auVar22._4_2_;
          auVar88._4_2_ = -(ushort)(sVar92 < -1) | (ushort)(sVar92 >= -1) * sVar92;
          sVar93 = auVar22._6_2_;
          auVar88._6_2_ = -(ushort)(sVar93 < -1) | (ushort)(sVar93 >= -1) * sVar93;
          sVar94 = auVar22._8_2_;
          auVar88._8_2_ = -(ushort)(sVar94 < -1) | (ushort)(sVar94 >= -1) * sVar94;
          sVar95 = auVar22._10_2_;
          auVar88._10_2_ = -(ushort)(sVar95 < -1) | (ushort)(sVar95 >= -1) * sVar95;
          sVar96 = auVar22._12_2_;
          sVar97 = auVar22._14_2_;
          auVar88._12_2_ = -(ushort)(sVar96 < -1) | (ushort)(sVar96 >= -1) * sVar96;
          auVar88._14_2_ = -(ushort)(sVar97 < -1) | (ushort)(sVar97 >= -1) * sVar97;
          sVar3 = (short)(auVar88._0_4_ - (uint)auVar41._14_2_);
          if (sVar3 < 0x10) {
            auVar22 = pshufhw(auVar22,auVar41,0xff);
            sVar39 = auVar22._8_2_;
            auVar89._0_2_ = uVar29 - sVar39;
            sVar44 = auVar22._10_2_;
            auVar89._2_2_ = uVar31 - sVar44;
            auVar89._4_2_ = auVar88._4_2_ - sVar39;
            auVar89._6_2_ = auVar88._6_2_ - sVar44;
            auVar89._8_2_ = auVar88._8_2_ - sVar39;
            auVar89._10_2_ = auVar88._10_2_ - sVar44;
            auVar89._12_2_ = auVar88._12_2_ - sVar39;
            auVar89._14_2_ = auVar88._14_2_ - sVar44;
            auVar42._0_2_ = auVar41._0_2_ - sVar39;
            auVar42._2_2_ = auVar41._2_2_ - sVar44;
            auVar42._4_2_ = auVar41._4_2_ - sVar39;
            auVar42._6_2_ = auVar41._6_2_ - sVar44;
            auVar42._8_2_ = auVar41._8_2_ - sVar39;
            auVar42._10_2_ = auVar41._10_2_ - sVar44;
            auVar42._12_2_ = auVar41._12_2_ - sVar39;
            auVar42._14_2_ = auVar41._14_2_ - sVar44;
            auVar40 = packsswb(auVar89,auVar42);
            auVar22 = *(undefined1 (*) [16])
                       LoadMaskz2
                       [(short)((int)((uint)(ushort)(sVar3 >> 0xf) << 0x10 |
                                     auVar88._0_4_ - (uint)auVar41._14_2_ & 0xffff) / 4)];
            auVar69 = pshufb(*(undefined1 (*) [16])(left + (short)auVar41._14_2_) & auVar22,auVar40)
            ;
            auVar76 = pshufb(*(undefined1 (*) [16])(left + (long)(short)auVar41._14_2_ + 1) &
                             auVar22,auVar40);
            auVar90 = pmovzxbw(auVar40,auVar69);
            auVar83 = pmovzxbw(auVar22,auVar76);
            auVar43[1] = 0;
            auVar43[0] = auVar69[8];
            auVar43[2] = auVar69[9];
            auVar43[3] = 0;
            auVar43[4] = auVar69[10];
            auVar43[5] = 0;
            auVar43[6] = auVar69[0xb];
            auVar43[7] = 0;
            auVar43[8] = auVar69[0xc];
            auVar43[9] = 0;
            auVar43[10] = auVar69[0xd];
            auVar43[0xb] = 0;
            auVar43[0xc] = auVar69[0xe];
            auVar43[0xd] = 0;
            auVar43[0xe] = auVar69[0xf];
            auVar43[0xf] = 0;
            auVar99[1] = 0;
            auVar99[0] = auVar76[8];
            auVar99[2] = auVar76[9];
            auVar99[3] = 0;
            auVar99[4] = auVar76[10];
            auVar99[5] = 0;
            auVar99[6] = auVar76[0xb];
            auVar99[7] = 0;
            auVar99[8] = auVar76[0xc];
            auVar99[9] = 0;
            auVar99[10] = auVar76[0xd];
            auVar99[0xb] = 0;
            auVar99[0xc] = auVar76[0xe];
            auVar99[0xd] = 0;
            auVar99[0xe] = auVar76[0xf];
            auVar99[0xf] = 0;
          }
          else {
            auVar98._0_2_ = -(ushort)(auVar19._0_2_ < sVar39);
            auVar98._2_2_ = -(ushort)(auVar19._2_2_ < sVar44);
            auVar98._4_2_ = -(ushort)(auVar19._4_2_ < sVar45);
            auVar98._6_2_ = -(ushort)(auVar19._6_2_ < sVar46);
            auVar98._8_2_ = -(ushort)(auVar19._8_2_ < sVar47);
            auVar98._10_2_ = -(ushort)(auVar19._10_2_ < sVar48);
            auVar98._12_2_ = -(ushort)(auVar19._12_2_ < sVar49);
            auVar98._14_2_ = -(ushort)(auVar19._14_2_ < sVar50);
            auVar84._0_2_ = -(ushort)(auVar19._0_2_ < sVar85);
            auVar84._2_2_ = -(ushort)(auVar19._2_2_ < sVar91);
            auVar84._4_2_ = -(ushort)(auVar19._4_2_ < sVar92);
            auVar84._6_2_ = -(ushort)(auVar19._6_2_ < sVar93);
            auVar84._8_2_ = -(ushort)(auVar19._8_2_ < sVar94);
            auVar84._10_2_ = -(ushort)(auVar19._10_2_ < sVar95);
            auVar84._12_2_ = -(ushort)(auVar19._12_2_ < sVar96);
            auVar84._14_2_ = -(ushort)(auVar19._14_2_ < sVar97);
            auVar84 = auVar84 & auVar88;
            auVar98 = auVar98 & auVar41;
            auVar90._8_8_ =
                 (ulong)left[auVar84._8_2_] | (ulong)left[auVar84._10_2_] << 0x10 |
                 (ulong)left[auVar84._12_2_] << 0x20 | (ulong)left[auVar84._14_2_] << 0x30;
            auVar90._0_8_ =
                 (ulong)left[auVar84._0_2_] | (ulong)left[auVar84._2_2_] << 0x10 |
                 (ulong)left[auVar84._4_2_] << 0x20 | (ulong)left[auVar84._6_2_] << 0x30;
            auVar43._8_8_ =
                 (ulong)left[auVar98._8_2_] | (ulong)left[auVar98._10_2_] << 0x10 |
                 (ulong)left[auVar98._12_2_] << 0x20 | (ulong)left[auVar98._14_2_] << 0x30;
            auVar43._0_8_ =
                 (ulong)left[auVar98._0_2_] | (ulong)left[auVar98._2_2_] << 0x10 |
                 (ulong)left[auVar98._4_2_] << 0x20 | (ulong)left[auVar98._6_2_] << 0x30;
            auVar83._8_8_ =
                 (ulong)left[(short)(auVar84._8_2_ + 1)] |
                 (ulong)left[(short)(auVar84._10_2_ + 1)] << 0x10 |
                 (ulong)left[(short)(auVar84._12_2_ + 1)] << 0x20 |
                 (ulong)left[(short)(auVar84._14_2_ + 1)] << 0x30;
            auVar83._0_8_ =
                 (ulong)left[(short)(auVar84._0_2_ + 1)] |
                 (ulong)left[(short)(auVar84._2_2_ + 1)] << 0x10 |
                 (ulong)left[(short)(auVar84._4_2_ + 1)] << 0x20 |
                 (ulong)left[(short)(auVar84._6_2_ + 1)] << 0x30;
            auVar99._8_8_ =
                 (ulong)left[(short)(auVar98._8_2_ + 1)] |
                 (ulong)left[(short)(auVar98._10_2_ + 1)] << 0x10 |
                 (ulong)left[(short)(auVar98._12_2_ + 1)] << 0x20 |
                 (ulong)left[(short)(auVar98._14_2_ + 1)] << 0x30;
            auVar99._0_8_ =
                 (ulong)left[(short)(auVar98._0_2_ + 1)] |
                 (ulong)left[(short)(auVar98._2_2_ + 1)] << 0x10 |
                 (ulong)left[(short)(auVar98._4_2_ + 1)] << 0x20 |
                 (ulong)left[(short)(auVar98._6_2_ + 1)] << 0x30;
          }
          auVar71._0_2_ = auVar70._0_2_ >> 1;
          auVar71._2_2_ = auVar70._2_2_ >> 1;
          auVar71._4_2_ = auVar70._4_2_ >> 1;
          auVar71._6_2_ = auVar70._6_2_ >> 1;
          auVar71._8_2_ = auVar70._8_2_ >> 1;
          auVar71._10_2_ = auVar70._10_2_ >> 1;
          auVar71._12_2_ = auVar70._12_2_ >> 1;
          auVar71._14_2_ = auVar70._14_2_ >> 1;
          auVar71 = auVar71 & auVar52;
          auVar26._0_2_ = auVar25._0_2_ >> 1;
          auVar26._2_2_ = auVar25._2_2_ >> 1;
          auVar26._4_2_ = auVar25._4_2_ >> 1;
          auVar26._6_2_ = auVar25._6_2_ >> 1;
          auVar26._8_2_ = auVar25._8_2_ >> 1;
          auVar26._10_2_ = auVar25._10_2_ >> 1;
          auVar26._12_2_ = auVar25._12_2_ >> 1;
          auVar26._14_2_ = auVar25._14_2_ >> 1;
          auVar26 = auVar26 & auVar52;
          auVar22 = psllw(auVar90,5);
          uVar61 = (ushort)(auVar22._0_2_ + sVar30 + (auVar83._0_2_ - auVar90._0_2_) * auVar71._0_2_
                           ) >> 5;
          uVar62 = (ushort)(auVar22._2_2_ + sVar32 + (auVar83._2_2_ - auVar90._2_2_) * auVar71._2_2_
                           ) >> 5;
          uVar63 = (ushort)(auVar22._4_2_ + sVar65 + (auVar83._4_2_ - auVar90._4_2_) * auVar71._4_2_
                           ) >> 5;
          uVar64 = (ushort)(auVar22._6_2_ + sVar72 + (auVar83._6_2_ - auVar90._6_2_) * auVar71._6_2_
                           ) >> 5;
          uVar78 = (ushort)(auVar22._8_2_ + sVar35 + (auVar83._8_2_ - auVar90._8_2_) * auVar71._8_2_
                           ) >> 5;
          uVar79 = (ushort)(auVar22._10_2_ + sVar36 +
                           (auVar83._10_2_ - auVar90._10_2_) * auVar71._10_2_) >> 5;
          uVar80 = (ushort)(auVar22._12_2_ + sVar37 +
                           (auVar83._12_2_ - auVar90._12_2_) * auVar71._12_2_) >> 5;
          uVar81 = (ushort)(auVar22._14_2_ + sVar38 +
                           (auVar83._14_2_ - auVar90._14_2_) * auVar71._14_2_) >> 5;
          auVar22 = psllw(auVar43,5);
          uVar29 = (ushort)(auVar22._0_2_ + sVar30 + (auVar99._0_2_ - auVar43._0_2_) * auVar26._0_2_
                           ) >> 5;
          uVar31 = (ushort)(auVar22._2_2_ + sVar32 + (auVar99._2_2_ - auVar43._2_2_) * auVar26._2_2_
                           ) >> 5;
          uVar33 = (ushort)(auVar22._4_2_ + sVar65 + (auVar99._4_2_ - auVar43._4_2_) * auVar26._4_2_
                           ) >> 5;
          uVar34 = (ushort)(auVar22._6_2_ + sVar72 + (auVar99._6_2_ - auVar43._6_2_) * auVar26._6_2_
                           ) >> 5;
          uVar53 = (ushort)(auVar22._8_2_ + sVar35 + (auVar99._8_2_ - auVar43._8_2_) * auVar26._8_2_
                           ) >> 5;
          uVar58 = (ushort)(auVar22._10_2_ + sVar36 +
                           (auVar99._10_2_ - auVar43._10_2_) * auVar26._10_2_) >> 5;
          uVar59 = (ushort)(auVar22._12_2_ + sVar37 +
                           (auVar99._12_2_ - auVar43._12_2_) * auVar26._12_2_) >> 5;
          uVar60 = (ushort)(auVar22._14_2_ + sVar38 +
                           (auVar99._14_2_ - auVar43._14_2_) * auVar26._14_2_) >> 5;
          auVar87[1] = (uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62);
          auVar87[0] = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
          auVar87[2] = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
          auVar87[3] = (uVar64 != 0) * (uVar64 < 0x100) * (char)uVar64 - (0xff < uVar64);
          auVar87[4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
          auVar87[5] = (uVar79 != 0) * (uVar79 < 0x100) * (char)uVar79 - (0xff < uVar79);
          auVar87[6] = (uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80);
          auVar87[7] = (uVar81 != 0) * (uVar81 < 0x100) * (char)uVar81 - (0xff < uVar81);
          auVar87[8] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
          auVar87[9] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
          auVar87[10] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
          auVar87[0xb] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
          auVar87[0xc] = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
          auVar87[0xd] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
          auVar87[0xe] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
          auVar87[0xf] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
        }
        auVar22 = pblendvb(auVar75,auVar87,(undefined1  [16])Mask[0][uVar11]);
        *(undefined1 (*) [16])(local_60 + lVar9) = auVar22;
        uVar14 = uVar14 - 0x10;
      }
      local_60 = local_60 + stride;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z2_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_above, int upsample_left, int dx,
                                 int dy) {
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      dr_prediction_z2_Nx4_sse4_1(bh, dst, stride, above, left, upsample_above,
                                  upsample_left, dx, dy);
      break;
    case 8:
      dr_prediction_z2_Nx8_sse4_1(bh, dst, stride, above, left, upsample_above,
                                  upsample_left, dx, dy);
      break;
    default:
      dr_prediction_z2_HxW_sse4_1(bh, bw, dst, stride, above, left,
                                  upsample_above, upsample_left, dx, dy);
  }
  return;
}